

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::PortalImageInfiniteLight::ImageLookup
          (PortalImageInfiniteLight *this,Point2f uv,SampledWavelengths *lambda)

{
  Float *pFVar1;
  int c;
  int c_00;
  Float FVar2;
  float fVar3;
  float fVar7;
  undefined1 in_register_00001208 [56];
  undefined1 auVar5 [64];
  undefined1 auVar8 [56];
  undefined1 auVar10 [56];
  SampledSpectrum SVar11;
  RGBIlluminantSpectrum spec;
  Float local_94;
  Float local_90;
  Float local_8c;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  SampledWavelengths *local_70;
  undefined1 local_68 [16];
  RGB local_58;
  RGBIlluminantSpectrum local_48;
  undefined1 auVar6 [64];
  undefined1 auVar4 [16];
  undefined1 auVar9 [64];
  
  auVar5._8_56_ = in_register_00001208;
  auVar5._0_8_ = uv.super_Tuple2<pbrt::Point2,_float>;
  _local_88 = auVar5._0_16_;
  local_68 = vmovshdup_avx(_local_88);
  c_00 = 0;
  local_8c = 0.0;
  local_94 = 0.0;
  local_90 = 0.0;
  local_70 = lambda;
  do {
    lambda = (SampledWavelengths *)
             (CONCAT44(SUB84(lambda,4),
                       (int)((float)(this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x *
                            (float)local_88._0_4_)) |
             (ulong)(uint)(int)((float)(this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y *
                               (float)local_68._0_4_) << 0x20);
    FVar2 = Image::GetChannel(&this->image,(Point2i)lambda,c_00,(WrapMode2D)0x200000002);
    pFVar1 = &local_8c;
    if ((c_00 != 0) && (pFVar1 = &local_90, c_00 == 1)) {
      pFVar1 = &local_94;
    }
    c_00 = c_00 + 1;
    *pFVar1 = FVar2;
  } while (c_00 != 3);
  auVar4 = vinsertps_avx(ZEXT416((uint)local_8c),ZEXT416((uint)local_94),0x10);
  auVar4 = vmaxps_avx(auVar4,ZEXT816(0) << 0x40);
  local_58._0_8_ = vmovlps_avx(auVar4);
  auVar4 = vmaxss_avx(ZEXT416((uint)local_90),ZEXT816(0) << 0x40);
  auVar10 = ZEXT856(auVar4._8_8_);
  local_58.b = auVar4._0_4_;
  RGBIlluminantSpectrum::RGBIlluminantSpectrum(&local_48,this->imageColorSpace,&local_58);
  FVar2 = this->scale;
  local_88._4_4_ = FVar2;
  local_88._0_4_ = FVar2;
  fStack_80 = FVar2;
  fStack_7c = FVar2;
  auVar8 = ZEXT856(local_88._8_8_);
  SVar11 = RGBIlluminantSpectrum::Sample(&local_48,local_70);
  auVar9._0_8_ = SVar11.values.values._8_8_;
  auVar9._8_56_ = auVar10;
  auVar6._0_8_ = SVar11.values.values._0_8_;
  auVar6._8_56_ = auVar8;
  auVar4 = vmovlhps_avx(auVar6._0_16_,auVar9._0_16_);
  fVar3 = auVar4._0_4_ * (float)local_88._0_4_;
  fVar7 = auVar4._4_4_ * (float)local_88._4_4_;
  auVar4 = CONCAT412(auVar4._12_4_ * fStack_7c,
                     CONCAT48(auVar4._8_4_ * fStack_80,CONCAT44(fVar7,fVar3)));
  auVar4 = vshufpd_avx(auVar4,auVar4,1);
  SVar11.values.values._8_8_ = auVar4._0_8_;
  SVar11.values.values[0] = fVar3;
  SVar11.values.values[1] = fVar7;
  return (SampledSpectrum)SVar11.values.values;
}

Assistant:

SampledSpectrum PortalImageInfiniteLight::ImageLookup(
    Point2f uv, const SampledWavelengths &lambda) const {
    RGB rgb;
    for (int c = 0; c < 3; ++c)
        rgb[c] = image.LookupNearestChannel(uv, c);
    RGBIlluminantSpectrum spec(*imageColorSpace, ClampZero(rgb));
    return scale * spec.Sample(lambda);
}